

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O1

void uv__async_stop(uv_loop_t *loop)

{
  int iVar1;
  uv__queue *q_00;
  uv_async_t *h;
  uv__queue *q;
  uv__queue queue;
  uv_loop_t *loop_local;
  
  if ((loop->async_io_watcher).fd != -1) {
    queue.prev = (uv__queue *)loop;
    uv__queue_move(&loop->async_handles,(uv__queue *)&q);
    while (iVar1 = uv__queue_empty((uv__queue *)&q), iVar1 == 0) {
      q_00 = uv__queue_head((uv__queue *)&q);
      uv__queue_remove(q_00);
      uv__queue_insert_tail(queue.prev + 0x1b,q_00);
      uv__async_spin((uv_async_t *)&q_00[-7].prev);
    }
    if (*(int *)&queue.prev[0x20].next != -1) {
      if (*(int *)&queue.prev[0x20].next != *(int *)&queue.prev[0x1f].prev) {
        uv__close(*(int *)&queue.prev[0x20].next);
      }
      *(undefined4 *)&queue.prev[0x20].next = 0xffffffff;
    }
    uv__io_stop((uv_loop_t *)queue.prev,(uv__io_t *)&queue.prev[0x1c].prev,1);
    uv__close(*(int *)&queue.prev[0x1f].prev);
    *(undefined4 *)&queue.prev[0x1f].prev = 0xffffffff;
  }
  return;
}

Assistant:

void uv__async_stop(uv_loop_t* loop) {
  struct uv__queue queue;
  struct uv__queue* q;
  uv_async_t* h;

  if (loop->async_io_watcher.fd == -1)
    return;

  /* Make sure no other thread is accessing the async handle fd after the loop
   * cleanup.
   */
  uv__queue_move(&loop->async_handles, &queue);
  while (!uv__queue_empty(&queue)) {
    q = uv__queue_head(&queue);
    h = uv__queue_data(q, uv_async_t, queue);

    uv__queue_remove(q);
    uv__queue_insert_tail(&loop->async_handles, q);

    uv__async_spin(h);
  }

  if (loop->async_wfd != -1) {
    if (loop->async_wfd != loop->async_io_watcher.fd)
      uv__close(loop->async_wfd);
    loop->async_wfd = -1;
  }

  uv__io_stop(loop, &loop->async_io_watcher, POLLIN);
  uv__close(loop->async_io_watcher.fd);
  loop->async_io_watcher.fd = -1;
}